

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureBarrierBasicOutline::TextureBarrierBasicOutline
          (TextureBarrierBasicOutline *this,Context *context,API api,char *name,char *description)

{
  size_t i;
  long lVar1;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TextureBarrierBaseTest).super_TestCase.m_context = context;
  (this->super_TextureBarrierBaseTest).m_api = api;
  (this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02126d00;
  lVar1 = 0;
  this->m_width = 0;
  this->m_height = 0;
  this->m_actual = (GLuint *)0x0;
  *(undefined8 *)&(this->super_TextureBarrierBaseTest).field_0x7c = 0;
  this->m_vbo = 0;
  this->m_fbo = 0;
  do {
    this->m_tex[lVar1] = 0;
    this->m_reference[lVar1] = (GLuint *)0x0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

TextureBarrierBasicOutline(deqp::Context& context, TextureBarrierTests::API api, const char* name,
							   const char* description)
		: TextureBarrierBaseTest(context, api, name, description)
		, m_program(0)
		, m_vao(0)
		, m_vbo(0)
		, m_fbo(0)
		, m_width(0)
		, m_height(0)
		, m_actual(DE_NULL)
	{
		for (size_t i = 0; i < NUM_TEXTURES; ++i)
		{
			m_tex[i]	   = 0;
			m_reference[i] = DE_NULL;
		}
	}